

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

void mutex_prof_data_init(mutex_prof_data_t *data)

{
  data->prev_owner = (tsdn_t *)0x0;
  data->n_lock_ops = 0;
  data->max_n_thds = 0;
  data->n_waiting_thds = 0;
  data->n_owner_switches = 0;
  data->n_wait_times = 0;
  data->n_spin_acquired = 0;
  (data->tot_wait_time).ns = 0;
  (data->max_wait_time).ns = 0;
  duckdb_je_nstime_copy(&data->max_wait_time,&nstime_zero);
  duckdb_je_nstime_copy(&data->tot_wait_time,&nstime_zero);
  data->prev_owner = (tsdn_t *)0x0;
  return;
}

Assistant:

static void
mutex_prof_data_init(mutex_prof_data_t *data) {
	memset(data, 0, sizeof(mutex_prof_data_t));
	nstime_init_zero(&data->max_wait_time);
	nstime_init_zero(&data->tot_wait_time);
	data->prev_owner = NULL;
}